

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunadaptcontroller_soderlind.c
# Opt level: O2

SUNAdaptController SUNAdaptController_PID(SUNContext_conflict sunctx)

{
  SUNAdaptController C;
  
  C = SUNAdaptController_Soderlind(sunctx);
  SUNAdaptController_SetParams_PID(C,0.58,-0.21,0.1);
  return C;
}

Assistant:

SUNAdaptController SUNAdaptController_PID(SUNContext sunctx)
{
  SUNFunctionBegin(sunctx);

  SUNAdaptController C = SUNAdaptController_Soderlind(sunctx);
  SUNCheckLastErrNull();

  SUNCheckCallNull(SUNAdaptController_SetParams_PID(C, DEFAULT_PID_K1,
                                                    DEFAULT_PID_K2,
                                                    DEFAULT_PID_K3));

  return (C);
}